

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O0

void Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(OpCode *op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode *op_local;
  
  bVar2 = OpCodeAttr::IsProfiledOp(*op);
  if (bVar2) {
    operator-=(op,1);
    bVar2 = OpCodeAttr::HasProfiledOp(*op);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0x30,"(OpCodeAttr::HasProfiledOp(op))",
                                  "OpCodeAttr::HasProfiledOp(op)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    bVar2 = OpCodeAttr::IsProfiledOpWithICIndex(*op);
    if (bVar2) {
      operator-=(op,2);
      bVar2 = OpCodeAttr::HasProfiledOpWithICIndex(*op);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                    ,0x35,"(OpCodeAttr::HasProfiledOpWithICIndex(op))",
                                    "OpCodeAttr::HasProfiledOpWithICIndex(op)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0x39,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void OpCodeUtil::ConvertNonCallOpToNonProfiled(OpCode& op)
    {
        if (OpCodeAttr::IsProfiledOp(op))
        {
            op -= 1;
            Assert(OpCodeAttr::HasProfiledOp(op));
        }
        else if (OpCodeAttr::IsProfiledOpWithICIndex(op))
        {
            op -= 2;
            Assert(OpCodeAttr::HasProfiledOpWithICIndex(op));
        }
        else
        {
            Assert(false);
        }
    }